

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
Rml::Context::GenerateKeyModifierEventParameters
          (Context *this,Dictionary *parameters,int key_modifier_state)

{
  int iVar1;
  type this_00;
  uint local_4c;
  int local_48;
  undefined1 local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  int i;
  allocator<char> local_29;
  String *local_28;
  uint local_1c;
  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
  *pfStack_18;
  int key_modifier_state_local;
  Dictionary *parameters_local;
  Context *this_local;
  
  local_1c = key_modifier_state;
  pfStack_18 = (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                *)parameters;
  parameters_local = (Dictionary *)this;
  if (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                                 ::property_names_abi_cxx11_);
    if (iVar1 != 0) {
      local_43 = 1;
      local_28 = GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                 ::property_names_abi_cxx11_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                 ::property_names_abi_cxx11_,"ctrl_key",&local_29);
      local_28 = (String *)0x844be0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 1),"shift_key",(allocator<char> *)((long)&i + 3));
      local_28 = (String *)0x844c00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 2),"alt_key",(allocator<char> *)((long)&i + 2));
      local_28 = (String *)0x844c20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 3),"meta_key",(allocator<char> *)((long)&i + 1));
      local_28 = (String *)0x844c40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 4),"caps_lock_key",(allocator<char> *)&i);
      local_28 = (String *)0x844c60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 5),"num_lock_key",&local_41);
      local_28 = (String *)0x844c80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 6),"scroll_lock_key",&local_42);
      local_43 = 0;
      ::std::allocator<char>::~allocator(&local_42);
      ::std::allocator<char>::~allocator(&local_41);
      ::std::allocator<char>::~allocator((allocator<char> *)&i);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
      ::std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                           ::property_names_abi_cxx11_);
    }
  }
  for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
    local_4c = (uint)(0 < (int)(local_1c & 1 << ((byte)local_48 & 0x1f)));
    this_00 = itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::operator[]<std::__cxx11::string_const&>
                        (pfStack_18,
                         GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                         ::property_names_abi_cxx11_ + local_48);
    Variant::operator=(this_00,(int *)&local_4c);
  }
  return;
}

Assistant:

void Context::GenerateKeyModifierEventParameters(Dictionary& parameters, int key_modifier_state)
{
	static const String property_names[] = {"ctrl_key", "shift_key", "alt_key", "meta_key", "caps_lock_key", "num_lock_key", "scroll_lock_key"};

	for (int i = 0; i < 7; i++)
		parameters[property_names[i]] = (int)((key_modifier_state & (1 << i)) > 0);
}